

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AtomStamp.cpp
# Opt level: O2

void __thiscall OpenMD::AtomStamp::AtomStamp(AtomStamp *this,int index)

{
  _Rb_tree_header *p_Var1;
  allocator<char> local_71;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_70;
  size_type local_68;
  char local_60 [8];
  undefined8 uStack_58;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  local_50;
  
  DataHolder::DataHolder(&this->super_DataHolder);
  (this->super_DataHolder)._vptr_DataHolder = (_func_int **)&PTR__AtomStamp_002beab0;
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Parameter(&this->Type);
  Vector<double,_3U>::Vector(&(this->position_).super_Vector<double,_3U>);
  Vector<double,_3U>::Vector(&(this->orientation_).super_Vector<double,_3U>);
  this->havePos_ = false;
  this->haveOrt_ = false;
  this->hasOverride_ = false;
  this->index_ = index;
  (this->bonds_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->bonds_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->bonds_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->bondedAtoms_)._M_t._M_impl.super__Rb_tree_header;
  (this->bondedAtoms_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->bondedAtoms_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->bondedAtoms_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->bondedAtoms_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->bondedAtoms_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"type",(allocator<char> *)&local_70);
  std::__cxx11::string::_M_assign((string *)&(this->Type).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"type",&local_71);
  local_50.first._M_string_length = local_68;
  local_50.first._M_dataplus._M_p = (pointer)&local_50.first.field_2;
  if (local_70 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60) {
    local_50.first.field_2._8_8_ = uStack_58;
  }
  else {
    local_50.first._M_dataplus._M_p = (pointer)local_70;
  }
  local_68 = 0;
  local_60[0] = '\0';
  local_70 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_60;
  local_50.second = &(this->Type).super_ParameterBase;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)&(this->super_DataHolder).parameters_,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  return;
}

Assistant:

AtomStamp::AtomStamp(int index) :
      havePos_(false), haveOrt_(false), hasOverride_(false), index_(index) {
    DefineParameter(Type, "type");
  }